

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

EvaluatedTargetPropertyEntries *
anon_unknown.dwarf_1264e09::EvaluateTargetPropertyEntries
          (EvaluatedTargetPropertyEntries *__return_storage_ptr__,cmGeneratorTarget *thisTarget,
          string *config,string *lang,cmGeneratorExpressionDAGChecker *dagChecker,
          vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
          *in)

{
  pointer pEVar1;
  pointer extraout_RAX;
  pointer extraout_RAX_00;
  string *__alloc;
  pointer puVar2;
  _Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
  *this;
  pointer puVar3;
  EvaluatedTargetPropertyEntry local_68;
  
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->Entries).
           super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->Entries).
           super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (__return_storage_ptr__->Entries).
  super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Entries).
  super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar2 = (in->
           super__Vector_base<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (in->
           super__Vector_base<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  this = (_Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
          *)((long)puVar3 - (long)puVar2 >> 3);
  pEVar1 = (pointer)0x24924924924924a;
  if (this < (_Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
              *)0x24924924924924a) {
    if (puVar3 != puVar2) {
      __alloc = lang;
      pEVar1 = std::
               _Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
               ::_M_allocate(this,(size_t)thisTarget);
      std::
      vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ::_S_relocate((pointer)0x0,(pointer)0x0,pEVar1,(_Tp_alloc_type *)__alloc);
      puVar2 = (in->
               super__Vector_base<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (in->
               super__Vector_base<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->Entries).
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_start = pEVar1;
      (__return_storage_ptr__->Entries).
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish = pEVar1;
      pEVar1 = pEVar1 + (long)this;
      (__return_storage_ptr__->Entries).
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pEVar1;
    }
    if (puVar2 != puVar3) {
      do {
        EvaluateTargetPropertyEntry
                  (&local_68,thisTarget,config,lang,dagChecker,
                   (puVar2->_M_t).
                   super___uniq_ptr_impl<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
                   .super__Head_base<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_false>.
                   _M_head_impl);
        std::
        vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
        ::emplace_back<(anonymous_namespace)::EvaluatedTargetPropertyEntry>
                  (&__return_storage_ptr__->Entries,&local_68);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68.Values);
        pEVar1 = extraout_RAX;
        if (local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                     TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
          pEVar1 = extraout_RAX_00;
        }
        puVar2 = puVar2 + 1;
      } while (puVar2 != puVar3);
    }
    return (EvaluatedTargetPropertyEntries *)pEVar1;
  }
  std::__throw_length_error("vector::reserve");
}

Assistant:

EvaluatedTargetPropertyEntries EvaluateTargetPropertyEntries(
  cmGeneratorTarget const* thisTarget, std::string const& config,
  std::string const& lang, cmGeneratorExpressionDAGChecker* dagChecker,
  std::vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry>> const&
    in)
{
  EvaluatedTargetPropertyEntries out;
  out.Entries.reserve(in.size());
  for (auto const& entry : in) {
    out.Entries.emplace_back(EvaluateTargetPropertyEntry(
      thisTarget, config, lang, dagChecker, *entry));
  }
  return out;
}